

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadFields(CrateReader *this)

{
  vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_> *this_00;
  pointer pSVar1;
  StreamReader *this_01;
  uint64_t uVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  size_t sVar8;
  ValueRep *pVVar9;
  pointer pFVar10;
  pointer pcVar11;
  int iVar12;
  size_t i;
  char *pcVar13;
  pointer pcVar14;
  size_t i_1;
  long lVar15;
  uint64_t num_fields;
  vector<char,_std::allocator<char>_> comp_buffer;
  uint64_t reps_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> reps_data;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  optional<tinyusdz::Token> local_208 [9];
  string local_90;
  string local_70;
  string local_50;
  
  lVar15 = this->_fields_index;
  if ((lVar15 < 0) ||
     (pSVar1 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5 <= lVar15)) {
LAB_00194b66:
    ::std::__cxx11::string::append((char *)&this->_err);
    return false;
  }
  if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::to_string(&local_70,0);
    ::std::operator+(&local_248,"Version must be 0.4.0 or later, but got ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    ::std::operator+(&local_288,&local_248,".");
    ::std::__cxx11::to_string(&local_90,(uint)this->_version[1]);
    ::std::operator+(&local_228,&local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90)
    ;
    ::std::operator+(&local_268,&local_228,".");
    ::std::__cxx11::to_string(&local_50,(uint)this->_version[2]);
    ::std::operator+(&bStack_2a8,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &bStack_2a8,"\n");
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    return false;
  }
  if (pSVar1[lVar15].size == 0) {
    return true;
  }
  this_01 = this->_sr;
  if (this_01->length_ < (ulong)pSVar1[lVar15].start) goto LAB_00194b66;
  this_01->idx_ = pSVar1[lVar15].start;
  bVar5 = StreamReader::read8(this_01,(uint64_t *)&local_288);
  if (!bVar5) goto LAB_00194b66;
  if (local_288._M_dataplus._M_p == (pointer)0x0) {
    return true;
  }
  if ((pointer)(this->_config).maxNumFields < local_288._M_dataplus._M_p) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,"[Crate]");
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadFields");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x163f);
    ::std::operator<<(poVar6," ");
    pcVar13 = "Too many fields in `FIELDS` section.";
    goto LAB_00194de8;
  }
  uVar7 = (long)local_288._M_dataplus._M_p * 0x10 + this->_memoryUsage;
  this->_memoryUsage = uVar7;
  if ((this->_config).maxMemoryBudget < uVar7) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,"[Crate]");
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadFields");
    poVar6 = ::std::operator<<(poVar6,"():");
    iVar12 = 0x1649;
  }
  else {
    this_00 = &this->_fields;
    ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::resize
              (this_00,(size_type)local_288._M_dataplus._M_p);
    uVar7 = (long)local_288._M_dataplus._M_p * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar7;
    if ((this->_config).maxMemoryBudget < uVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadFields");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar12 = 0x1650;
    }
    else {
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268,
                 (size_type)local_288._M_dataplus._M_p);
      bVar5 = ReadCompressedInts<unsigned_int>
                        (this,(uint *)local_268._M_dataplus._M_p,(size_t)local_288._M_dataplus._M_p)
      ;
      if (bVar5) {
        pFVar10 = (this_00->
                  super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        for (pcVar14 = (pointer)0x0; local_288._M_dataplus._M_p != pcVar14; pcVar14 = pcVar14 + 1) {
          (pFVar10->token_index).super_Index.value =
               *(uint32_t *)(local_268._M_dataplus._M_p + (long)pcVar14 * 4);
          pFVar10 = pFVar10 + 1;
        }
        if (this->_memoryUsage < (ulong)((long)local_288._M_dataplus._M_p * 4)) {
          this->_memoryUsage = this->_memoryUsage + (long)local_288._M_dataplus._M_p * -4;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadFields");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1655);
        ::std::operator<<(poVar6," ");
        poVar6 = ::std::operator<<((ostream *)local_208,"Failed to read Field token_index array.");
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      }
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268);
      if (!bVar5) {
        return false;
      }
      bVar5 = StreamReader::read8(this->_sr,(uint64_t *)&local_248);
      if (!bVar5) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadFields");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1664);
        ::std::operator<<(poVar6," ");
        pcVar13 = "Failed to read value reps legnth at `FIELDS` section.";
        goto LAB_00194de8;
      }
      if ((pointer)pSVar1[lVar15].size < local_248._M_dataplus._M_p) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadFields");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1668);
        ::std::operator<<(poVar6," ");
        pcVar13 = "Invalid byte size of Value reps data.";
        goto LAB_00194de8;
      }
      if ((pointer)this->_sr->length_ < local_248._M_dataplus._M_p) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadFields");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x166c);
        ::std::operator<<(poVar6," ");
        pcVar13 = "Compressed Value reps size exceeds USDC data.";
        goto LAB_00194de8;
      }
      uVar2 = this->_memoryUsage;
      this->_memoryUsage = (uint64_t)(local_248._M_dataplus._M_p + uVar2);
      if (local_248._M_dataplus._M_p + uVar2 <= (pointer)(this->_config).maxMemoryBudget) {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_268,
                   (size_type)local_248._M_dataplus._M_p,(allocator_type *)local_208);
        _Var4._M_p = local_248._M_dataplus._M_p;
        pcVar14 = (pointer)StreamReader::read(this->_sr,(int)local_248._M_dataplus._M_p,
                                              local_248._M_dataplus._M_p,local_268._M_dataplus._M_p)
        ;
        _Var3._M_p = local_288._M_dataplus._M_p;
        if (_Var4._M_p == pcVar14) {
          pcVar14 = local_288._M_dataplus._M_p * 8;
          uVar2 = this->_memoryUsage;
          this->_memoryUsage = (uint64_t)(pcVar14 + uVar2);
          if (pcVar14 + uVar2 <= (pointer)(this->_config).maxMemoryBudget) {
            local_228._M_dataplus._M_p = (char *)0x0;
            local_228._M_string_length = 0;
            local_228.field_2._M_allocated_capacity = 0;
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
                       (size_type)local_288._M_dataplus._M_p);
            sVar8 = LZ4Compression::DecompressFromBuffer
                              (local_268._M_dataplus._M_p,local_228._M_dataplus._M_p,
                               (size_t)local_248._M_dataplus._M_p,(size_t)pcVar14,&this->_err);
            if ((long)pcVar14 - sVar8 == 0) {
              pVVar9 = &((this_00->
                         super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                         )._M_impl.super__Vector_impl_data._M_start)->value_rep;
              for (pcVar11 = (pointer)0x0; pcVar11 < local_288._M_dataplus._M_p;
                  pcVar11 = pcVar11 + 1) {
                pVVar9->data = *(uint64_t *)(local_228._M_dataplus._M_p + (long)pcVar11 * 8);
                pVVar9 = pVVar9 + 2;
              }
              pcVar11 = (pointer)this->_memoryUsage;
              if (pcVar11 < pcVar14) {
                this->_memoryUsage = (uint64_t)(pcVar11 + (long)_Var3._M_p * -8);
                pcVar11 = pcVar11 + (long)_Var3._M_p * -8;
              }
              if (pcVar11 < local_248._M_dataplus._M_p) {
                this->_memoryUsage = (long)pcVar11 - (long)local_248._M_dataplus._M_p;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
              poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadFields");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1686);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)local_208,"Failed to read Fields ValueRep data."
                                        );
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            }
            ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)&local_268);
            if ((long)pcVar14 - sVar8 != 0) {
              return false;
            }
            lVar15 = 0;
            for (pcVar14 = (pointer)0x0; pcVar14 < local_288._M_dataplus._M_p; pcVar14 = pcVar14 + 1
                ) {
              GetToken(local_208,this,
                       (Index)*(uint32_t *)
                               ((long)&(((this->_fields).
                                         super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->token_index).
                                       super_Index.value + lVar15));
              nonstd::optional_lite::optional<tinyusdz::Token>::~optional(local_208);
              lVar15 = lVar15 + 0x10;
            }
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[Crate]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadFields");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x167c);
          ::std::operator<<(poVar6," ");
          pcVar13 = "Reached to max memory budget.";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[Crate]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadFields");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1677);
          ::std::operator<<(poVar6," ");
          pcVar13 = "Failed to read reps data at `FIELDS` section.";
        }
        poVar6 = ::std::operator<<((ostream *)local_208,pcVar13);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_268);
        return false;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      poVar6 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadFields");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar12 = 0x166f;
    }
  }
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar12);
  ::std::operator<<(poVar6," ");
  pcVar13 = "Reached to max memory budget.";
LAB_00194de8:
  poVar6 = ::std::operator<<((ostream *)local_208,pcVar13);
  ::std::operator<<(poVar6,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  return false;
}

Assistant:

bool CrateReader::ReadFields() {
  if ((_fields_index < 0) || (_fields_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fields_index)];

  if (s.size == 0) {
    // accepts Empty FIELDS size.
    return true;
  }

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDS` section.\n";
    return false;
  }

  uint64_t num_fields;
  if (!_sr->read8(&num_fields)) {
    _err += "Failed to read # of fields at `FIELDS` section.\n";
    return false;
  }

  DCOUT("num_fields = " << num_fields);

  if (num_fields == 0) {
    // Fields may be empty, so OK
    return true;
  }

  if (num_fields > _config.maxNumFields) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
  }

  if (sizeof(void *) == 4) {
    // 32bit
    if (num_fields > std::numeric_limits<int32_t>::max() / sizeof(uint32_t)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
    }
  }

  CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(Field));

  _fields.resize(static_cast<size_t>(num_fields));

  // indices
  {

    CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

    std::vector<uint32_t> tmp;
    tmp.resize(size_t(num_fields));
    if (!ReadCompressedInts(tmp.data(), size_t(num_fields))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Field token_index array.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].token_index.value = tmp[i];
    }

    REDUCE_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

  }

  // Value reps(LZ4 compressed)
  {
    uint64_t reps_size; // compressed size
    if (!_sr->read8(&reps_size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read value reps legnth at `FIELDS` section.");
    }

    if (reps_size > size_t(s.size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid byte size of Value reps data.");
    }

    if (reps_size > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed Value reps size exceeds USDC data.");
    }

    CHECK_MEMORY_USAGE(size_t(reps_size));

    // TODO: Decompress from _sr directly.
    std::vector<char> comp_buffer(static_cast<size_t>(reps_size));

    if (reps_size !=
        _sr->read(size_t(reps_size), size_t(reps_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read reps data at `FIELDS` section.");
    }

    // reps datasize = LZ4 compressed. uncompressed size = num_fields * 8 bytes
    size_t uncompressed_size = size_t(num_fields) * sizeof(uint64_t);
    CHECK_MEMORY_USAGE(uncompressed_size);

    std::vector<uint64_t> reps_data;
    reps_data.resize(static_cast<size_t>(num_fields));


    if (uncompressed_size != LZ4Compression::DecompressFromBuffer(
                                 comp_buffer.data(),
                                 reinterpret_cast<char *>(reps_data.data()),
                                 size_t(reps_size), uncompressed_size, &_err)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Fields ValueRep data.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].value_rep = crate::ValueRep(reps_data[i]);
    }

    REDUCE_MEMORY_USAGE(uncompressed_size);
    REDUCE_MEMORY_USAGE(size_t(reps_size)); // comp_buffer
  }

  DCOUT("num_fields = " << num_fields);
  for (size_t i = 0; i < num_fields; i++) {
    if (auto tokv = GetToken(_fields[i].token_index)) {
      DCOUT("field[" << i << "] name = " << tokv.value()
                     << ", value = " << _fields[i].value_rep.GetStringRepr());
    }
  }

  return true;
}